

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

int orbit_prune(saucy *s)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  lVar5 = (long)s->start[s->lev];
  uVar1 = (s->right).clen[lVar5];
  piVar2 = (s->right).lab;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  uVar4 = 0xffffffffffffffff;
  for (; iVar3 = (int)uVar4, uVar7 != uVar6; uVar6 = uVar6 + 1) {
    if ((piVar2[lVar5 + (int)uVar1] < piVar2[lVar5 + uVar6]) &&
       ((iVar3 == -1 || (piVar2[lVar5 + uVar6] <= piVar2[lVar5 + iVar3])))) {
      uVar4 = uVar6 & 0xffffffff;
    }
  }
  return iVar3;
}

Assistant:

static int
orbit_prune(struct saucy *s)
{
    int i, label, fixed, min = -1;
    int k = s->start[s->lev];
    int size = s->right.clen[k] + 1;
    int *cell = s->right.lab + k;

    /* The previously fixed value */
    fixed = cell[size-1];

    /* Look for the next minimum cell representative */
    for (i = 0; i < size-1; ++i) {
        label = cell[i];

        /* Skip things we've already considered */
        if (label <= fixed) continue;

        /* Skip things that we'll consider later */
        if (min != -1 && label > cell[min]) continue;

        /* New candidate minimum */
        min = i;
    }

    return min;
}